

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ulong __thiscall smf::MidiFile::readVLValue(MidiFile *this,istream *input)

{
  uchar uVar1;
  bool bVar2;
  ulong uVar3;
  uchar *item;
  uchar *__end1;
  uchar *__begin1;
  uchar (*__range1) [5];
  istream *piStack_20;
  uchar b [5];
  istream *input_local;
  MidiFile *this_local;
  
  piStack_20 = input;
  memset((void *)((long)&__range1 + 3),0,5);
  for (__end1 = (uchar *)((long)&__range1 + 3); (istream **)__end1 != &stack0xffffffffffffffe0;
      __end1 = __end1 + 1) {
    uVar1 = readByte(this,piStack_20);
    *__end1 = uVar1;
    bVar2 = status(this);
    if (!bVar2) {
      return (ulong)(this->m_rwstatus & 1);
    }
    if (*__end1 < 0x80) break;
  }
  uVar3 = unpackVLV(this,__range1._3_1_,__range1._4_1_,__range1._5_1_,__range1._6_1_,__range1._7_1_)
  ;
  return uVar3;
}

Assistant:

ulong MidiFile::readVLValue(std::istream& input) {
	uchar b[5] = {0};

    for (uchar &item : b) {
            item = readByte(input);
            if (!status()) {
                    return m_rwstatus;
            }
            if (item < 0x80) {
                    break;
            }
    }

    return unpackVLV(b[0], b[1], b[2], b[3], b[4]);
}